

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

int SUNMatZero_Dense(SUNMatrix A)

{
  long lVar1;
  realtype *Adata;
  sunindextype i;
  SUNMatrix A_local;
  
  lVar1 = *(long *)((long)A->content + 0x10);
  for (Adata = (realtype *)0x0; (long)Adata < *(long *)((long)A->content + 0x18);
      Adata = (realtype *)((long)Adata + 1)) {
    *(undefined8 *)(lVar1 + (long)Adata * 8) = 0;
  }
  return 0;
}

Assistant:

int SUNMatZero_Dense(SUNMatrix A)
{
  sunindextype i;
  realtype *Adata;

  /* Perform operation */
  Adata = SM_DATA_D(A);
  for (i=0; i<SM_LDATA_D(A); i++)
    Adata[i] = ZERO;
  return 0;
}